

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

QPropertyAdaptorSlotObject * __thiscall
QObjectPrivate::getPropertyAdaptorSlotObject(QObjectPrivate *this,QMetaProperty *property)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Type pCVar4;
  QObject *pQVar5;
  QObjectPrivate *in_RDI;
  long in_FS_OFFSET;
  QMetaProperty *in_stack_00000010;
  QPropertyAdaptorSlotObject *p;
  Type c;
  ConnectionList *connectionList;
  int signal_index;
  QObject *q;
  Type conns;
  QMetaObject *metaObject;
  undefined8 in_stack_ffffffffffffff88;
  int iVar6;
  ConnectionData *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  QMetaObject **in_stack_ffffffffffffffa8;
  Type local_50;
  QPropertyAdaptorSlotObject *local_18;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
                     ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3fa143);
  if (pCVar4 != (Type)0x0) {
    pQVar5 = q_func(in_RDI);
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    (**pQVar5->_vptr_QObject)();
    QMetaProperty::notifySignalIndex(in_stack_00000010);
    iVar2 = methodIndexToSignalIndex(in_stack_ffffffffffffffa8,iVar2);
    iVar3 = ConnectionData::signalVectorCount(in_stack_ffffffffffffff90);
    if (iVar3 <= iVar2) {
      local_18 = (QPropertyAdaptorSlotObject *)0x0;
      goto LAB_003fa264;
    }
    ConnectionData::connectionsForSignal(in_stack_ffffffffffffff90,iVar6);
    local_50 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                         ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3fa1e2);
    while (local_50 != (Type)0x0) {
      if ((*(uint *)&local_50->field_0x54 >> 0x1d & 1) != 0) {
        iVar6 = SUB84(local_50->field_6,4);
        QMetaProperty::propertyIndex((QMetaProperty *)CONCAT44(iVar2,in_stack_ffffffffffffff98));
        local_18 = QtPrivate::QPropertyAdaptorSlotObject::cast
                             ((QSlotObjectBase *)CONCAT44(iVar2,in_stack_ffffffffffffff98),iVar6);
        if (local_18 != (QPropertyAdaptorSlotObject *)0x0) goto LAB_003fa264;
      }
      local_50 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                           ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3fa252);
    }
  }
  local_18 = (QPropertyAdaptorSlotObject *)0x0;
LAB_003fa264:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

QtPrivate::QPropertyAdaptorSlotObject *
QObjectPrivate::getPropertyAdaptorSlotObject(const QMetaProperty &property)
{
    if (auto conns = connections.loadAcquire()) {
        Q_Q(QObject);
        const QMetaObject *metaObject = q->metaObject();
        int signal_index = methodIndexToSignalIndex(&metaObject, property.notifySignalIndex());
        if (signal_index >= conns->signalVectorCount())
            return nullptr;
        const auto &connectionList = conns->connectionsForSignal(signal_index);
        for (auto c = connectionList.first.loadRelaxed(); c;
             c = c->nextConnectionList.loadRelaxed()) {
            if (c->isSlotObject) {
                if (auto p = QtPrivate::QPropertyAdaptorSlotObject::cast(c->slotObj,
                                                                         property.propertyIndex()))
                    return p;
            }
        }
    }
    return nullptr;
}